

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

RsWeightClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RsWeightClauseSyntax,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::syntax::RsProdSyntax*&>
          (BumpAllocator *this,Token *args,ExpressionSyntax *args_1,RsProdSyntax **args_2)

{
  Token colonEqual;
  RsWeightClauseSyntax *pRVar1;
  RsWeightClauseSyntax *in_RCX;
  BumpAllocator *in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffd8;
  
  pRVar1 = (RsWeightClauseSyntax *)allocate(in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8);
  colonEqual.info = in_RSI;
  colonEqual._0_8_ = in_RDX;
  slang::syntax::RsWeightClauseSyntax::RsWeightClauseSyntax
            (in_RCX,colonEqual,(ExpressionSyntax *)in_RSI->location,
             (RsProdSyntax *)in_RSI->rawTextPtr);
  return pRVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }